

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

void __thiscall nv::FloatImage::initFrom(FloatImage *this,Image *img)

{
  int iVar1;
  uint w;
  uint h;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  Color32 *c;
  anon_union_4_2_12391d8d_for_Color32_0 local_44;
  anon_union_4_2_12391d8d_for_Color32_0 local_40;
  Color32 pixel;
  uint i;
  uint count;
  float *alpha_channel;
  float *blue_channel;
  float *green_channel;
  float *red_channel;
  Image *img_local;
  FloatImage *this_local;
  
  if ((img == (Image *)0x0) &&
     (iVar1 = nvAbort("img != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                      ,0x45,"void nv::FloatImage::initFrom(const Image *)"), iVar1 == 1)) {
    raise(5);
  }
  w = Image::width(img);
  h = Image::height(img);
  allocate(this,4,w,h);
  pfVar2 = channel(this,0);
  pfVar3 = channel(this,1);
  pfVar4 = channel(this,2);
  pfVar5 = channel(this,3);
  pixel.field_0 =
       (anon_union_4_2_12391d8d_for_Color32_0)((uint)this->m_width * (uint)this->m_height);
  for (local_40.u = 0; local_40.u < (uint)pixel.field_0; local_40.u = local_40.u + 1) {
    c = Image::pixel(img,local_40.u);
    Color32::Color32((Color32 *)&local_44.field_0,c);
    pfVar2[local_40.u] = (float)local_44._2_1_ / 255.0;
    pfVar3[local_40.u] = (float)local_44._1_1_ / 255.0;
    pfVar4[local_40.u] = (float)local_44._0_1_ / 255.0;
    pfVar5[local_40.u] = (float)local_44._3_1_ / 255.0;
  }
  return;
}

Assistant:

void FloatImage::initFrom(const Image * img)
{
	nvCheck(img != NULL);
	
	allocate(4, img->width(), img->height());
	
	float * red_channel = channel(0);
	float * green_channel = channel(1);
	float * blue_channel = channel(2);
	float * alpha_channel = channel(3);
	
	const uint count = m_width * m_height;
	for(uint i = 0; i < count; i++) {
		Color32 pixel = img->pixel(i);
		red_channel[i] = float(pixel.r) / 255.0f;
		green_channel[i] = float(pixel.g) / 255.0f;
		blue_channel[i] = float(pixel.b) / 255.0f;
		alpha_channel[i] = float(pixel.a) / 255.0f;
	}
}